

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndMainMenuBar(void)

{
  ImGuiContext *g;
  ImGuiWindow *in_stack_00000010;
  
  EndMenuBar();
  if ((GImGui->CurrentWindow == GImGui->NavWindow) && (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    FocusPreviousWindowIgnoringOne(in_stack_00000010);
  }
  End();
  return;
}

Assistant:

void ImGui::EndMainMenuBar()
{
    EndMenuBar();

    // When the user has left the menu layer (typically: closed menus through activation of an item), we restore focus to the previous window
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow == g.NavWindow && g.NavLayer == 0)
        FocusPreviousWindowIgnoringOne(g.NavWindow);

    End();
}